

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O0

int fits_rdecomp(uchar *c,int clen,uint *array,int nx,int nblock)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  int bbits;
  int fsbits;
  int fsmax;
  uint lastpix;
  uint diff;
  uint b;
  uchar bytevalue;
  uchar *cend;
  int fs;
  int nzero;
  int nbits;
  int imax;
  int k;
  int i;
  int nblock_local;
  int nx_local;
  uint *array_local;
  byte *pbStack_18;
  int clen_local;
  uchar *c_local;
  
  if (clen < 4) {
    ffpmsg("decompression error: input buffer not properly allocated");
  }
  else {
    fsbits = (uint)*c << 0x18 | (uint)c[1] << 0x10 | (uint)c[2] << 8 | (uint)c[3];
    pbVar5 = c + 4;
    pbStack_18 = c + 5;
    lastpix = (uint)*pbVar5;
    fs = 8;
    imax = 0;
    do {
      if (nx <= imax) {
        if (pbStack_18 < pbVar5 + (long)clen + -4) {
          ffpmsg("decompression warning: unused bytes at end of compressed buffer");
        }
        return 0;
      }
      for (fs = fs + -5; fs < 0; fs = fs + 8) {
        lastpix = lastpix << 8 | (uint)*pbStack_18;
        pbStack_18 = pbStack_18 + 1;
      }
      bVar6 = (byte)fs;
      iVar1 = (lastpix >> (bVar6 & 0x1f)) - 1;
      lastpix = (1 << (bVar6 & 0x1f)) - 1U & lastpix;
      nzero = imax + nblock;
      if (nx < nzero) {
        nzero = nx;
      }
      if (iVar1 < 0) {
        for (; imax < nzero; imax = imax + 1) {
          array[imax] = fsbits;
        }
      }
      else if (iVar1 == 0x19) {
        for (; imax < nzero; imax = imax + 1) {
          nbits = 0x20 - fs;
          fsmax = lastpix << ((byte)nbits & 0x1f);
          while( true ) {
            nbits = nbits + -8;
            if (nbits < 0) break;
            fsmax = (uint)*pbStack_18 << ((byte)nbits & 0x1f) | fsmax;
            pbStack_18 = pbStack_18 + 1;
          }
          if (fs < 1) {
            lastpix = 0;
          }
          else {
            fsmax = (uint)(*pbStack_18 >> (-(byte)nbits & 0x1f)) | fsmax;
            lastpix = (1 << (bVar6 & 0x1f)) - 1U & (uint)*pbStack_18;
            pbStack_18 = pbStack_18 + 1;
          }
          if ((fsmax & 1U) == 0) {
            fsmax = (uint)fsmax >> 1;
          }
          else {
            fsmax = (uint)fsmax >> 1 ^ 0xffffffff;
          }
          array[imax] = fsmax + fsbits;
          fsbits = array[imax];
        }
      }
      else {
        for (; imax < nzero; imax = imax + 1) {
          while (lastpix == 0) {
            fs = fs + 8;
            lastpix = (uint)*pbStack_18;
            pbStack_18 = pbStack_18 + 1;
          }
          iVar2 = fs - nonzero_count[lastpix];
          iVar3 = fs - (iVar2 + 1);
          lastpix = 1 << ((byte)iVar3 & 0x1f) ^ lastpix;
          for (fs = iVar3 - iVar1; fs < 0; fs = fs + 8) {
            lastpix = lastpix << 8 | (uint)*pbStack_18;
            pbStack_18 = pbStack_18 + 1;
          }
          uVar4 = iVar2 << ((byte)iVar1 & 0x1f) | lastpix >> ((byte)fs & 0x1f);
          lastpix = (1 << ((byte)fs & 0x1f)) - 1U & lastpix;
          if ((uVar4 & 1) == 0) {
            fsmax = uVar4 >> 1;
          }
          else {
            fsmax = uVar4 >> 1 ^ 0xffffffff;
          }
          array[imax] = fsmax + fsbits;
          fsbits = array[imax];
        }
      }
    } while (pbStack_18 <= pbVar5 + (long)clen + -4);
    ffpmsg("decompression error: hit end of compressed byte stream");
  }
  return 1;
}

Assistant:

int fits_rdecomp (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned int array[],	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
/* int bsize;  */
int i, k, imax;
int nbits, nzero, fs;
unsigned char *cend, bytevalue;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 4; */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 5;
    fsmax = 25;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first 4 bytes of input buffer contain the value of the first */
    /* 4 byte integer value, without any encoding */
    
    if (clen < 4)
    {
       ffpmsg("decompression error: input buffer not properly allocated");
       return 1;
    }
    lastpix = 0;
    bytevalue = c[0];
    lastpix = lastpix | (bytevalue<<24);
    bytevalue = c[1];
    lastpix = lastpix | (bytevalue<<16);
    bytevalue = c[2];
    lastpix = lastpix | (bytevalue<<8);
    bytevalue = c[3];
    lastpix = lastpix | bytevalue;

    c += 4;  
    cend = c + clen - 4;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}